

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Integer MA_inquire_heap_check_stack(Integer datatype)

{
  long datatype_00;
  Integer IVar1;
  Integer IVar2;
  long in_RDI;
  Integer unaff_retaddr;
  Integer nelem_frag;
  Integer nelem_gap;
  size_t gap_length;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  Pointer in_stack_fffffffffffffff8;
  
  ma_stats.calls[0xf] = ma_stats.calls[0xf] + 1;
  if (ma_initialized == 0) {
    sprintf(ma_ebuf,"MA not yet initialized");
    ma_error((ErrorLevel)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
             (ErrorType)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0);
    IVar1 = 0;
  }
  else if ((in_RDI < 1000) || (0x3f8 < in_RDI)) {
    sprintf(ma_ebuf,"invalid datatype: %ld",in_RDI);
    ma_error((ErrorLevel)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
             (ErrorType)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0);
    IVar1 = 0;
  }
  else {
    if ((ulong)((long)ma_sp - (long)ma_hp) < (ulong)((long)ma_partition - (long)ma_hp)) {
      datatype_00 = (long)ma_sp - (long)ma_hp;
    }
    else {
      datatype_00 = (long)ma_partition - (long)ma_hp;
    }
    if (datatype_00 == 0) {
      IVar1 = 0;
    }
    else {
      IVar1 = ma_nelem(in_stack_fffffffffffffff8,in_RDI - 1000,datatype_00);
    }
    IVar2 = ma_max_heap_frag_nelem(unaff_retaddr,(Integer)in_stack_fffffffffffffff8);
    if (IVar1 < IVar2) {
      IVar1 = IVar2;
    }
  }
  return IVar1;
}

Assistant:

public Integer MA_inquire_heap_check_stack(Integer datatype)
{
    size_t    gap_length;    /* # of bytes between heap and partition */
    Integer    nelem_gap;    /* max elements containable in gap */
    Integer    nelem_frag;    /* max elements containable in any frag */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_inquire_heap_check_stack]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return DONTCARE;
#endif /* VERIFY */

    /* verify initialization */
    if (!ma_initialized)
    {
        (void)sprintf(ma_ebuf,
            "MA not yet initialized");
        ma_error(EL_Nonfatal, ET_External, "MA_inquire_heap_check_stack", ma_ebuf);
        return (Integer)0;
    }

    /* verify datatype */
    if (!mt_valid(datatype))
    {
        (void)sprintf(ma_ebuf,
            "invalid datatype: %ld",
            (size_t)datatype);
        ma_error(EL_Fatal, ET_External, "MA_inquire_heap_check_stack", ma_ebuf);
        return DONTCARE;
    }

    /* convert datatype to internal (index-suitable) value */
    datatype = mt_import(datatype);

    /*
     * compute the # of elements for which space is available
     */

    /* try space between heap and partition or heap and stack */
    gap_length = min((size_t)(ma_partition - ma_hp), (size_t)(ma_sp - ma_hp));
    if (gap_length > 0)
        nelem_gap = ma_nelem(ma_hp, (ulongi)gap_length, datatype);
    else
        nelem_gap = 0;

    /* try heap fragments */
    nelem_frag = ma_max_heap_frag_nelem(datatype, nelem_gap);

    /* success */
    return max(nelem_gap, nelem_frag);
}